

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedEnumFieldGenerator::GenerateMergeFromCodedStreamWithPacking
          (RepeatedEnumFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  Printer *printer_local;
  RepeatedEnumFieldGenerator *this_local;
  
  bVar1 = FieldDescriptor::is_packed(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "::google::protobuf::uint32 length;\nDO_(input->ReadVarint32(&length));\n::google::protobuf::io::CodedInputStream::Limit limit = input->PushLimit(length);\nwhile (input->BytesUntilLimit() > 0) {\n  int value;\n  DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n       input, &value)));\n"
                      );
    pFVar2 = FieldDescriptor::file(this->descriptor_);
    bVar1 = HasPreservingUnknownEnumSemantics(pFVar2);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,"  add_$name$(static_cast< $type$ >(value));\n");
    }
    else {
      io::Printer::Print(printer,&this->variables_,
                         "  if ($type$_IsValid(value)) {\n    add_$name$(static_cast< $type$ >(value));\n  } else {\n"
                        );
      pFVar2 = FieldDescriptor::file(this->descriptor_);
      bVar1 = UseUnknownFieldSet(pFVar2,(this->super_FieldGenerator).options_);
      if (bVar1) {
        io::Printer::Print(printer,&this->variables_,
                           "    mutable_unknown_fields()->AddVarint($number$, value);\n");
      }
      else {
        io::Printer::Print(printer,&this->variables_,
                           "    unknown_fields_stream.WriteVarint32(tag);\n    unknown_fields_stream.WriteVarint32(value);\n"
                          );
      }
      io::Printer::Print(printer,"  }\n");
    }
    io::Printer::Print(printer,&this->variables_,"}\ninput->PopLimit(limit);\n");
  }
  else {
    pFVar2 = FieldDescriptor::file(this->descriptor_);
    bVar1 = HasPreservingUnknownEnumSemantics(pFVar2);
    if (bVar1) {
      io::Printer::Print(printer,&this->variables_,
                         "DO_((::google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns(\n       input,\n       $number$,\n       NULL,\n       NULL,\n       this->mutable_$name$())));\n"
                        );
    }
    else {
      pFVar2 = FieldDescriptor::file(this->descriptor_);
      bVar1 = UseUnknownFieldSet(pFVar2,(this->super_FieldGenerator).options_);
      if (bVar1) {
        io::Printer::Print(printer,&this->variables_,
                           "DO_((::google::protobuf::internal::WireFormat::ReadPackedEnumPreserveUnknowns(\n       input,\n       $number$,\n       $type$_IsValid,\n       mutable_unknown_fields(),\n       this->mutable_$name$())));\n"
                          );
      }
      else {
        io::Printer::Print(printer,&this->variables_,
                           "DO_((::google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns(\n       input,\n       $number$,\n       $type$_IsValid,\n       &unknown_fields_stream,\n       this->mutable_$name$())));\n"
                          );
      }
    }
  }
  return;
}

Assistant:

void RepeatedEnumFieldGenerator::
GenerateMergeFromCodedStreamWithPacking(io::Printer* printer) const {
  if (!descriptor_->is_packed()) {
      // This path is rarely executed, so we use a non-inlined implementation.
    if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
      printer->Print(variables_,
        "DO_((::google::protobuf::internal::"
                    "WireFormatLite::ReadPackedEnumPreserveUnknowns(\n"
        "       input,\n"
        "       $number$,\n"
        "       NULL,\n"
        "       NULL,\n"
        "       this->mutable_$name$())));\n");
    } else if (UseUnknownFieldSet(descriptor_->file(), options_)) {
      printer->Print(variables_,
        "DO_((::google::protobuf::internal::WireFormat::ReadPackedEnumPreserveUnknowns(\n"
        "       input,\n"
        "       $number$,\n"
        "       $type$_IsValid,\n"
        "       mutable_unknown_fields(),\n"
        "       this->mutable_$name$())));\n");
    } else {
      printer->Print(variables_,
        "DO_((::google::protobuf::internal::"
                     "WireFormatLite::ReadPackedEnumPreserveUnknowns(\n"
        "       input,\n"
        "       $number$,\n"
        "       $type$_IsValid,\n"
        "       &unknown_fields_stream,\n"
        "       this->mutable_$name$())));\n");
    }
  } else {
    printer->Print(variables_,
      "::google::protobuf::uint32 length;\n"
      "DO_(input->ReadVarint32(&length));\n"
      "::google::protobuf::io::CodedInputStream::Limit limit = "
          "input->PushLimit(length);\n"
      "while (input->BytesUntilLimit() > 0) {\n"
      "  int value;\n"
      "  DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<\n"
      "         int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(\n"
      "       input, &value)));\n");
    if (HasPreservingUnknownEnumSemantics(descriptor_->file())) {
      printer->Print(variables_,
      "  add_$name$(static_cast< $type$ >(value));\n");
    } else {
      printer->Print(variables_,
      "  if ($type$_IsValid(value)) {\n"
      "    add_$name$(static_cast< $type$ >(value));\n"
      "  } else {\n");
      if (UseUnknownFieldSet(descriptor_->file(), options_)) {
        printer->Print(variables_,
        "    mutable_unknown_fields()->AddVarint($number$, value);\n");
      } else {
        printer->Print(variables_,
        "    unknown_fields_stream.WriteVarint32(tag);\n"
        "    unknown_fields_stream.WriteVarint32(value);\n");
      }
      printer->Print(
      "  }\n");
    }
    printer->Print(variables_,
      "}\n"
      "input->PopLimit(limit);\n");
  }
}